

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

void __thiscall
AssemblyCode::MoveRegRegCommand::MoveRegRegCommand
          (MoveRegRegCommand *this,CTemp *_target,CTemp *_source)

{
  CTemp *_source_local;
  CTemp *_target_local;
  MoveRegRegCommand *this_local;
  
  AssemblyCommand::AssemblyCommand(&this->super_AssemblyCommand);
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_00239ba8;
  IRT::CTemp::CTemp(&this->source,_source);
  IRT::CTemp::CTemp(&this->target,_target);
  return;
}

Assistant:

AssemblyCode::MoveRegRegCommand::MoveRegRegCommand(
        IRT::CTemp _target, IRT::CTemp _source
) : source( _source ), target( _target ) { }